

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

int32_t ncat(char *buffer,uint32_t buflen,...)

{
  undefined8 *in_RAX;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar2;
  undefined8 *puVar3;
  undefined8 in_R8;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 in_R9;
  long lVar6;
  char *pcVar7;
  undefined8 in_XMM0_Qa;
  void *in_XMM1_Qa;
  undefined8 local_b8 [4];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  va_list args;
  
  local_b8[2] = in_RDX;
  local_b8[3] = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  if ((char)in_RAX != '\0') {
    uStack_88 = in_XMM0_Qa;
    args[0].overflow_arg_area = in_XMM1_Qa;
  }
  if (buffer != (char *)0x0) {
    in_RAX = local_b8;
    uVar1 = 0x10;
    puVar4 = (undefined8 *)&stack0x00000008;
    lVar6 = 0;
    while( true ) {
      if (uVar1 < 0x29) {
        uVar5 = (ulong)uVar1;
        uVar1 = uVar1 + 8;
        puVar3 = puVar4;
        puVar4 = (undefined8 *)((long)in_RAX + uVar5);
      }
      else {
        puVar3 = puVar4 + 1;
      }
      pcVar7 = (char *)*puVar4;
      if (pcVar7 == (char *)0x0) break;
      lVar2 = lVar6;
      for (; (puVar4 = puVar3, lVar6 = 0x9c, lVar2 != 0x9c && (lVar6 = lVar2, *pcVar7 != '\0'));
          pcVar7 = pcVar7 + 1) {
        buffer[lVar2] = *pcVar7;
        lVar2 = lVar2 + 1;
      }
    }
    buffer[lVar6] = '\0';
  }
  return (int32_t)in_RAX;
}

Assistant:

static int32_t ncat(char *buffer, uint32_t buflen, ...) {
  va_list args;
  char *str;
  char *p = buffer;
  const char* e = buffer + buflen - 1;

  if (buffer == NULL || buflen < 1) {
    return -1;
  }

  va_start(args, buflen);
  while ((str = va_arg(args, char *)) != 0) {
    char c;
    while (p != e && (c = *str++) != 0) {
      *p++ = c;
    }
  }
  *p = 0;
  va_end(args);

  return static_cast<int32_t>(p - buffer);
}